

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O1

void dumpStringOffsetsSection
               (raw_ostream *OS,StringRef SectionName,DWARFObject *Obj,
               DWARFSection *StringOffsetsSection,StringRef StringSection,unit_iterator_range Units,
               bool LittleEndian,uint MaxVersion)

{
  char cVar1;
  ushort uVar2;
  undefined4 uVar3;
  DWARFUnit *pDVar4;
  char *__n;
  uint64_t uVar5;
  uint64_t uVar6;
  undefined8 uVar7;
  bool bVar8;
  undefined7 uVar9;
  byte bVar10;
  uint32_t uVar11;
  ulong uVar12;
  raw_ostream *prVar13;
  DWARFSection *pDVar14;
  pointer pOVar15;
  DWARFSection *pDVar16;
  size_t sVar17;
  undefined **__n_00;
  long lVar18;
  pointer pOVar19;
  char *pcVar20;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *__end1;
  undefined1 auVar21 [8];
  _func_int **pp_Var22;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *__begin1;
  long lVar23;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  DWARFSection *local_f8;
  uint64_t StringOffset;
  undefined1 local_e8 [8];
  DWARFDataExtractor StrOffsetExt;
  undefined **local_b8;
  undefined1 local_a0 [8];
  DataExtractor StrData;
  undefined **local_70;
  uint64_t offset;
  DWARFSection *local_60;
  undefined1 auStack_58 [8];
  ContributionCollection Contributions;
  DWARFSection *local_38;
  uint64_t Offset;
  
  StrOffsetExt.super_DataExtractor.Data.Length._0_1_ = LittleEndian;
  if (MaxVersion < 5) {
    local_e8 = (undefined1  [8])(StringOffsetsSection->Data).Data;
    pp_Var22 = (_func_int **)(StringOffsetsSection->Data).Length;
    StrOffsetExt.super_DataExtractor.Data.Length._1_1_ = 0;
    local_70 = (_func_int **)0x0;
    StrOffsetExt.super_DataExtractor.Data.Data = (char *)pp_Var22;
    if (((ulong)pp_Var22 & 3) != 0) {
      Str.Length = 0x10;
      Str.Data = "error: size of .";
      prVar13 = llvm::raw_ostream::operator<<(OS,Str);
      prVar13 = llvm::raw_ostream::operator<<(prVar13,SectionName);
      Str_00.Length = 0x16;
      Str_00.Data = " is not a multiple of ";
      prVar13 = llvm::raw_ostream::operator<<(prVar13,Str_00);
      prVar13 = llvm::raw_ostream::operator<<(prVar13,4);
      Str_01.Length = 2;
      Str_01.Data = ".\n";
      llvm::raw_ostream::operator<<(prVar13,Str_01);
      pp_Var22 = (_func_int **)((ulong)pp_Var22 & 0xfffffffffffffffc);
    }
    auStack_58 = (undefined1  [8])StringSection.Data;
    Contributions.
    super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)StringSection.Length;
    Contributions.
    super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_2_ = CONCAT11(0,LittleEndian);
    if (local_70 < pp_Var22) {
      do {
        StrData.Data.Data = "0x%8.8lx: ";
        local_a0 = (undefined1  [8])&PTR_home_00d8c7c0;
        StrData.Data.Length = (size_t)local_70;
        llvm::raw_ostream::operator<<(OS,(format_object_base *)local_a0);
        uVar11 = llvm::DataExtractor::getU32
                           ((DataExtractor *)local_e8,(uint64_t *)&stack0xffffffffffffff90,
                            (Error *)0x0);
        StrData.Data.Length = (size_t)uVar11;
        StrData.Data.Data = "%8.8lx  ";
        local_a0 = (undefined1  [8])&PTR_home_00d8c7c0;
        local_38 = (DWARFSection *)StrData.Data.Length;
        llvm::raw_ostream::operator<<(OS,(format_object_base *)local_a0);
        pcVar20 = llvm::DataExtractor::getCStr((DataExtractor *)auStack_58,(uint64_t *)&local_38);
        if (pcVar20 != (char *)0x0) {
          StrData.Data.Data = "\"%s\"";
          local_a0 = (undefined1  [8])&PTR_home_00d8cb40;
          StrData.Data.Length = (size_t)pcVar20;
          llvm::raw_ostream::operator<<(OS,(format_object_base *)local_a0);
        }
        Str_02.Length = 1;
        Str_02.Data = "\n";
        llvm::raw_ostream::operator<<(OS,Str_02);
      } while (local_70 < pp_Var22);
    }
  }
  else {
    StrData._16_8_ = StringSection.Data;
    auStack_58 = (undefined1  [8])0x0;
    Contributions.
    super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    Contributions.
    super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (Units.begin_iterator != Units.end_iterator) {
      do {
        pDVar4 = ((Units.begin_iterator)->_M_t).
                 super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>._M_t.
                 super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
                 super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl;
        if (*(bool *)((long)&(pDVar4->StringOffsetsTableContribution).Storage + 0x18) == true) {
          if (Contributions.
              super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              Contributions.
              super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::
            vector<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>>>
            ::_M_realloc_insert<llvm::Optional<llvm::StrOffsetsContributionDescriptor>const&>
                      ((vector<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>>>
                        *)auStack_58,
                       (iterator)
                       Contributions.
                       super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       &pDVar4->StringOffsetsTableContribution);
          }
          else {
            uVar5 = (pDVar4->StringOffsetsTableContribution).Storage.field_0.value.Base;
            uVar6 = *(uint64_t *)((long)&(pDVar4->StringOffsetsTableContribution).Storage + 8);
            uVar7 = *(undefined8 *)((long)&(pDVar4->StringOffsetsTableContribution).Storage + 0x18);
            *(undefined8 *)
             ((long)&((Contributions.
                       super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->Storage).field_0 + 0x10) =
                 *(undefined8 *)((long)&(pDVar4->StringOffsetsTableContribution).Storage + 0x10);
            *(undefined8 *)
             &((Contributions.
                super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->Storage).hasVal = uVar7;
            ((Contributions.
              super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->Storage).field_0.value.Base = uVar5;
            ((Contributions.
              super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->Storage).field_0.value.Size = uVar6;
            Contributions.
            super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 Contributions.
                 super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
          }
        }
        Units.begin_iterator = Units.begin_iterator + 1;
      } while (Units.begin_iterator != Units.end_iterator);
    }
    pOVar19 = Contributions.
              super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    auVar21 = auStack_58;
    if (auStack_58 !=
        (undefined1  [8])
        Contributions.
        super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar23 = (long)Contributions.
                     super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
                     ._M_impl.super__Vector_impl_data._M_start - (long)auStack_58;
      uVar12 = lVar23 >> 5;
      lVar18 = 0x3f;
      if (uVar12 != 0) {
        for (; uVar12 >> lVar18 == 0; lVar18 = lVar18 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>*,std::vector<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<collectContributionData(llvm::iterator_range<std::unique_ptr<llvm::DWARFUnit,std::default_delete<llvm::DWARFUnit>>*>)::__0>>
                (auStack_58,
                 Contributions.
                 super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,((uint)lVar18 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar23 < 0x201) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>*,std::vector<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>>>>,__gnu_cxx::__ops::_Iter_comp_iter<collectContributionData(llvm::iterator_range<std::unique_ptr<llvm::DWARFUnit,std::default_delete<llvm::DWARFUnit>>*>)::__0>>
                  (auVar21,pOVar19);
      }
      else {
        pOVar15 = (pointer)((long)auVar21 + 0x200);
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>*,std::vector<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>>>>,__gnu_cxx::__ops::_Iter_comp_iter<collectContributionData(llvm::iterator_range<std::unique_ptr<llvm::DWARFUnit,std::default_delete<llvm::DWARFUnit>>*>)::__0>>
                  (auVar21,pOVar15);
        for (; pOVar15 != pOVar19; pOVar15 = pOVar15 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>*,std::vector<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>>>>,__gnu_cxx::__ops::_Val_comp_iter<collectContributionData(llvm::iterator_range<std::unique_ptr<llvm::DWARFUnit,std::default_delete<llvm::DWARFUnit>>*>)::__0>>
                    (pOVar15);
        }
      }
    }
    pOVar19 = (pointer)((long)auStack_58 + 0x20);
    pOVar15 = Contributions.
              super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pOVar19 !=
        Contributions.
        super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
        ._M_impl.super__Vector_impl_data._M_start &&
        auStack_58 !=
        (undefined1  [8])
        Contributions.
        super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      do {
        if ((((pOVar19[-1].Storage.hasVal == true) && ((pOVar19->Storage).hasVal == true)) &&
            (pOVar19[-1].Storage.field_0.value.Base == (pOVar19->Storage).field_0.value.Base)) &&
           (pOVar19[-1].Storage.field_0.value.Size == (pOVar19->Storage).field_0.value.Size)) {
          pOVar15 = pOVar19 + -1;
          break;
        }
        pOVar19 = pOVar19 + 1;
      } while (pOVar19 !=
               Contributions.
               super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    }
    pOVar19 = Contributions.
              super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pOVar15 !=
        Contributions.
        super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      for (pOVar19 = pOVar15 + 2;
          pOVar19 !=
          Contributions.
          super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
          ._M_impl.super__Vector_impl_data._M_start; pOVar19 = pOVar19 + 1) {
        if ((((pOVar15->Storage).hasVal != true) || ((pOVar19->Storage).hasVal != true)) ||
           (((pOVar15->Storage).field_0.value.Base != (pOVar19->Storage).field_0.value.Base ||
            ((pOVar15->Storage).field_0.value.Size != (pOVar19->Storage).field_0.value.Size)))) {
          uVar5 = (pOVar19->Storage).field_0.value.Base;
          uVar6 = (pOVar19->Storage).field_0.value.Size;
          bVar8 = (pOVar19->Storage).hasVal;
          uVar9 = *(undefined7 *)&(pOVar19->Storage).field_0x19;
          *(undefined8 *)((long)&pOVar15[1].Storage.field_0 + 0x10) =
               *(undefined8 *)((long)&(pOVar19->Storage).field_0 + 0x10);
          pOVar15[1].Storage.hasVal = bVar8;
          *(undefined7 *)&pOVar15[1].Storage.field_0x19 = uVar9;
          pOVar15[1].Storage.field_0.value.Base = uVar5;
          pOVar15[1].Storage.field_0.value.Size = uVar6;
          pOVar15 = pOVar15 + 1;
        }
      }
      pOVar19 = pOVar15 + 1;
    }
    if (pOVar19 !=
        Contributions.
        super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      Contributions.
      super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pOVar19;
    }
    local_e8 = (undefined1  [8])(StringOffsetsSection->Data).Data;
    StrOffsetExt.super_DataExtractor.Data.Data = (char *)(StringOffsetsSection->Data).Length;
    StrOffsetExt.super_DataExtractor.Data.Length._1_1_ = 0;
    local_a0[0] = StrData.IsLittleEndian;
    local_a0[1] = StrData.AddressSize;
    local_a0._2_6_ = StrData._18_6_;
    StrData.Data.Data = (char *)StringSection.Length;
    StrData.Data.Length._0_2_ = CONCAT11(0,LittleEndian);
    local_38 = (DWARFSection *)0x0;
    StringOffset = (uint64_t)
                   Contributions.
                   super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    StrOffsetExt.super_DataExtractor._16_8_ = Obj;
    StrOffsetExt.Obj = (DWARFObject *)StringOffsetsSection;
    StrOffsetExt.Section = (DWARFSection *)StrOffsetExt.super_DataExtractor.Data.Data;
    if (auStack_58 !=
        (undefined1  [8])
        Contributions.
        super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_b8 = &PTR_home_00d8cb40;
      auVar21 = auStack_58;
      do {
        if ((((pointer)auVar21)->Storage).hasVal == false) {
          sVar17 = (long)OS->OutBufEnd - (long)OS->OutBufCur;
          if (sVar17 < 0x40) {
            OS = (raw_ostream *)llvm::raw_ostream::write(OS,0xbdb065,(void *)0x40,sVar17);
          }
          else {
            builtin_strncpy(OS->OutBufCur,
                            "error: invalid contribution to string offsets table in section .",0x40)
            ;
            OS->OutBufCur = OS->OutBufCur + 0x40;
          }
          prVar13 = llvm::raw_ostream::operator<<(OS,SectionName);
          pcVar20 = prVar13->OutBufCur;
          if (1 < (ulong)((long)prVar13->OutBufEnd - (long)pcVar20)) {
            pcVar20[0] = '.';
            pcVar20[1] = '\n';
            lVar18 = 2;
            goto LAB_00aef273;
          }
          llvm::raw_ostream::write(prVar13,0xbe36a2,(void *)0x2,(size_t)pcVar20);
          goto LAB_00aef276;
        }
        cVar1 = *(char *)((long)&(((pointer)auVar21)->Storage).field_0 + 0x13);
        uVar2 = (((pointer)auVar21)->Storage).field_0.value.FormParams.Version;
        uVar12 = (ulong)(cVar1 == '\0') << 3 | 0xfffffffffffffff0;
        bVar10 = (byte)uVar2;
        if (bVar10 < 5) {
          uVar12 = 0;
        }
        pDVar16 = (DWARFSection *)(uVar12 + (((pointer)auVar21)->Storage).field_0.value.Base);
        StrData._16_8_ = local_38;
        if (pDVar16 < local_38) {
          prVar13 = llvm::WithColor::error();
          pcVar20 = prVar13->OutBufCur;
          if ((ulong)((long)prVar13->OutBufEnd - (long)pcVar20) < 0x3e) {
            prVar13 = (raw_ostream *)
                      llvm::raw_ostream::write(prVar13,0xbdb0a6,(void *)0x3e,(size_t)pcVar20);
          }
          else {
            builtin_strncpy(pcVar20,"overlapping contributions to string offsets table in section ."
                            ,0x3e);
            prVar13->OutBufCur = prVar13->OutBufCur + 0x3e;
          }
          prVar13 = llvm::raw_ostream::operator<<(prVar13,SectionName);
          pcVar20 = prVar13->OutBufCur;
          if ((ulong)((long)prVar13->OutBufEnd - (long)pcVar20) < 2) {
            llvm::raw_ostream::write(prVar13,0xbe36a2,(void *)0x2,(size_t)pcVar20);
          }
          else {
            pcVar20[0] = '.';
            pcVar20[1] = '\n';
            prVar13->OutBufCur = prVar13->OutBufCur + 2;
          }
        }
        else {
          if (local_38 < pDVar16) {
            offset = (uint64_t)anon_var_dwarf_32217bb;
            local_70 = &PTR_home_00d8c7c0;
            local_60 = local_38;
            llvm::raw_ostream::operator<<(OS,(format_object_base *)&stack0xffffffffffffff90);
            prVar13 = llvm::raw_ostream::operator<<(OS,(long)pDVar16 - (long)local_38);
            pcVar20 = prVar13->OutBufCur;
            if (prVar13->OutBufEnd == pcVar20) {
              llvm::raw_ostream::write(prVar13,0xbbb18f,(void *)0x1,(size_t)pcVar20);
            }
            else {
              *pcVar20 = '\n';
              prVar13->OutBufCur = prVar13->OutBufCur + 1;
            }
          }
          offset = (long)"\n0x%8.8lx: " + 1;
          local_70 = &PTR_home_00d8c7c0;
          local_60 = pDVar16;
          llvm::raw_ostream::operator<<(OS,(format_object_base *)&stack0xffffffffffffff90);
          sVar17 = (long)OS->OutBufEnd - (long)OS->OutBufCur;
          if (sVar17 < 0x14) {
            prVar13 = (raw_ostream *)llvm::raw_ostream::write(OS,0xbdb0fe,(void *)0x14,sVar17);
          }
          else {
            builtin_strncpy(OS->OutBufCur,"Contribution size = ",0x14);
            OS->OutBufCur = OS->OutBufCur + 0x14;
            prVar13 = OS;
          }
          if ((((pointer)auVar21)->Storage).hasVal == false) {
LAB_00aef131:
            __assert_fail("hasVal",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/ADT/Optional.h"
                          ,0xad,
                          "T &llvm::optional_detail::OptionalStorage<llvm::StrOffsetsContributionDescriptor>::getValue() & [T = llvm::StrOffsetsContributionDescriptor]"
                         );
          }
          prVar13 = llvm::raw_ostream::operator<<
                              (prVar13,(ulong)(4 < bVar10) * 4 +
                                       (((pointer)auVar21)->Storage).field_0.value.Size);
          pcVar20 = prVar13->OutBufCur;
          if ((ulong)((long)prVar13->OutBufEnd - (long)pcVar20) < 0xb) {
            prVar13 = (raw_ostream *)
                      llvm::raw_ostream::write(prVar13,0xbdb113,(void *)0xb,(size_t)pcVar20);
          }
          else {
            builtin_strncpy(pcVar20,", Format = ",0xb);
            prVar13->OutBufCur = prVar13->OutBufCur + 0xb;
          }
          pcVar20 = "DWARF64";
          if (cVar1 == '\0') {
            pcVar20 = "DWARF32";
          }
          __n = prVar13->OutBufCur;
          if ((ulong)((long)prVar13->OutBufEnd - (long)__n) < 7) {
            prVar13 = (raw_ostream *)
                      llvm::raw_ostream::write(prVar13,(int)pcVar20,(void *)0x7,(size_t)__n);
          }
          else {
            uVar3 = *(undefined4 *)pcVar20;
            *(undefined4 *)(__n + 3) = *(undefined4 *)(pcVar20 + 3);
            *(undefined4 *)__n = uVar3;
            prVar13->OutBufCur = prVar13->OutBufCur + 7;
          }
          pcVar20 = prVar13->OutBufCur;
          if ((ulong)((long)prVar13->OutBufEnd - (long)pcVar20) < 0xc) {
            prVar13 = (raw_ostream *)
                      llvm::raw_ostream::write(prVar13,0xbdb127,(void *)0xc,(size_t)pcVar20);
          }
          else {
            builtin_strncpy(pcVar20,", Version = ",0xc);
            prVar13->OutBufCur = prVar13->OutBufCur + 0xc;
          }
          prVar13 = llvm::raw_ostream::operator<<(prVar13,(ulong)uVar2 & 0xff);
          pcVar20 = prVar13->OutBufCur;
          if (prVar13->OutBufEnd == pcVar20) {
            llvm::raw_ostream::write(prVar13,0xbbb18f,(void *)0x1,(size_t)pcVar20);
          }
          else {
            *pcVar20 = '\n';
            prVar13->OutBufCur = prVar13->OutBufCur + 1;
          }
          if ((((pointer)auVar21)->Storage).hasVal == false) goto LAB_00aef131;
          local_38 = (DWARFSection *)(((pointer)auVar21)->Storage).field_0.value.Base;
          cVar1 = *(char *)((long)&(((pointer)auVar21)->Storage).field_0 + 0x13);
          uVar11 = 4;
          if (cVar1 != '\0') {
            if (cVar1 != '\x01') {
              llvm::llvm_unreachable_internal
                        ("Invalid Format value",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/BinaryFormat/Dwarf.h"
                         ,0x230);
            }
            uVar11 = 8;
          }
          while ((long)local_38 - (((pointer)auVar21)->Storage).field_0.value.Base <
                 (((pointer)auVar21)->Storage).field_0.value.Size) {
            offset = (long)"\n0x%8.8lx: " + 1;
            local_70 = &PTR_home_00d8c7c0;
            local_60 = local_38;
            llvm::raw_ostream::operator<<(OS,(format_object_base *)&stack0xffffffffffffff90);
            local_f8 = (DWARFSection *)
                       llvm::DWARFDataExtractor::getRelocatedValue
                                 ((DWARFDataExtractor *)local_e8,uVar11,(uint64_t *)&local_38,
                                  (uint64_t *)0x0,(Error *)0x0);
            __n_00 = (undefined **)0xbdfa06;
            offset = (long)"0x%8.8lx " + 2;
            local_70 = &PTR_home_00d8c7c0;
            local_60 = local_f8;
            llvm::raw_ostream::operator<<(OS,(format_object_base *)&stack0xffffffffffffff90);
            pDVar14 = (DWARFSection *)
                      llvm::DataExtractor::getCStr((DataExtractor *)local_a0,(uint64_t *)&local_f8);
            if (pDVar14 != (DWARFSection *)0x0) {
              offset = (uint64_t)anon_var_dwarf_3221785;
              local_70 = &PTR_home_00d8cb40;
              __n_00 = local_b8;
              local_60 = pDVar14;
              llvm::raw_ostream::operator<<(OS,(format_object_base *)&stack0xffffffffffffff90);
            }
            if (OS->OutBufEnd == OS->OutBufCur) {
              llvm::raw_ostream::write(OS,0xbbb18f,(void *)0x1,(size_t)__n_00);
            }
            else {
              *OS->OutBufCur = '\n';
              OS->OutBufCur = OS->OutBufCur + 1;
            }
            if ((((pointer)auVar21)->Storage).hasVal == false) goto LAB_00aef131;
          }
        }
        if (pDVar16 < (ulong)StrData._16_8_) goto LAB_00aef276;
        auVar21 = (undefined1  [8])((long)auVar21 + 0x20);
      } while (auVar21 != (undefined1  [8])StringOffset);
    }
    if (local_38 < StrOffsetExt.Section) {
      offset = (uint64_t)anon_var_dwarf_32217bb;
      local_70 = &PTR_home_00d8c7c0;
      local_60 = local_38;
      llvm::raw_ostream::operator<<(OS,(format_object_base *)&stack0xffffffffffffff90);
      prVar13 = llvm::raw_ostream::operator<<(OS,(long)StrOffsetExt.Section - (long)local_38);
      pcVar20 = prVar13->OutBufCur;
      if (prVar13->OutBufEnd == pcVar20) {
        llvm::raw_ostream::write(prVar13,0xbbb18f,(void *)0x1,(size_t)pcVar20);
      }
      else {
        *pcVar20 = '\n';
        lVar18 = 1;
LAB_00aef273:
        prVar13->OutBufCur = prVar13->OutBufCur + lVar18;
      }
    }
LAB_00aef276:
    if (auStack_58 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_58,
                      (long)Contributions.
                            super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_58);
    }
  }
  return;
}

Assistant:

static void dumpStringOffsetsSection(raw_ostream &OS, StringRef SectionName,
                                     const DWARFObject &Obj,
                                     const DWARFSection &StringOffsetsSection,
                                     StringRef StringSection,
                                     DWARFContext::unit_iterator_range Units,
                                     bool LittleEndian, unsigned MaxVersion) {
  // If we have at least one (compile or type) unit with DWARF v5 or greater,
  // we assume that the section is formatted like a DWARF v5 string offsets
  // section.
  if (MaxVersion >= 5)
    dumpDWARFv5StringOffsetsSection(OS, SectionName, Obj, StringOffsetsSection,
                                    StringSection, Units, LittleEndian);
  else {
    DataExtractor strOffsetExt(StringOffsetsSection.Data, LittleEndian, 0);
    uint64_t offset = 0;
    uint64_t size = StringOffsetsSection.Data.size();
    // Ensure that size is a multiple of the size of an entry.
    if (size & ((uint64_t)(sizeof(uint32_t) - 1))) {
      OS << "error: size of ." << SectionName << " is not a multiple of "
         << sizeof(uint32_t) << ".\n";
      size &= -(uint64_t)sizeof(uint32_t);
    }
    DataExtractor StrData(StringSection, LittleEndian, 0);
    while (offset < size) {
      OS << format("0x%8.8" PRIx64 ": ", offset);
      uint64_t StringOffset = strOffsetExt.getU32(&offset);
      OS << format("%8.8" PRIx64 "  ", StringOffset);
      const char *S = StrData.getCStr(&StringOffset);
      if (S)
        OS << format("\"%s\"", S);
      OS << "\n";
    }
  }
}